

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void hd_vwarn(hd_context *ctx,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  char local_128 [8];
  char buf [256];
  __va_list_tag *ap_local;
  char *fmt_local;
  hd_context *ctx_local;
  
  snprintf(local_128,0x100,fmt,ap);
  buf[0xf7] = '\0';
  iVar1 = strcmp(local_128,ctx->warn->message);
  if (iVar1 == 0) {
    ctx->warn->count = ctx->warn->count + 1;
  }
  else {
    hd_flush_warnings(ctx);
    fprintf(_stderr,"warning: %s\n",local_128);
    hd_strlcpy(ctx->warn->message,local_128,0x100);
    ctx->warn->count = 1;
  }
  return;
}

Assistant:

void hd_vwarn(hd_context *ctx, const char *fmt, va_list ap)
{
    char buf[sizeof ctx->warn->message];

    snprintf(buf, sizeof buf, fmt, ap);
    buf[sizeof(buf) - 1] = 0;
#ifdef USE_OUTPUT_DEBUG_STRING
    OutputDebugStringA(buf);
	OutputDebugStringA("\n");
#endif

    if (!strcmp(buf, ctx->warn->message))
    {
        ctx->warn->count++;
    }
    else
    {
        hd_flush_warnings(ctx);
        fprintf(stderr, "warning: %s\n", buf);
        hd_strlcpy(ctx->warn->message, buf, sizeof ctx->warn->message);
        ctx->warn->count = 1;
    }
}